

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O0

void __thiscall
Assimp::AssbinExport::WriteBinaryNode(AssbinExport *this,IOStream *container,aiNode *node)

{
  uint local_a4;
  uint16_t local_92;
  aiString *local_90;
  void *value;
  aiString *paStack_80;
  aiMetadataType type;
  aiString *key;
  uint i_2;
  uint i_1;
  uint i;
  uint local_5c;
  undefined1 local_58 [4];
  uint nb_metadata;
  AssbinChunkWriter chunk;
  aiNode *node_local;
  IOStream *container_local;
  AssbinExport *this_local;
  
  chunk.initial = (size_t)node;
  AssbinChunkWriter::AssbinChunkWriter((AssbinChunkWriter *)local_58,container,0x123c,0x1000);
  if (*(long *)(chunk.initial + 0x470) == 0) {
    local_a4 = 0;
  }
  else {
    local_a4 = **(uint **)(chunk.initial + 0x470);
  }
  local_5c = local_a4;
  Write<aiString>((IOStream *)local_58,(aiString *)chunk.initial);
  Write<aiMatrix4x4t<float>>((IOStream *)local_58,(aiMatrix4x4 *)(chunk.initial + 0x404));
  Write<unsigned_int>((IOStream *)local_58,(uint *)(chunk.initial + 0x450));
  Write<unsigned_int>((IOStream *)local_58,(uint *)(chunk.initial + 0x460));
  Write<unsigned_int>((IOStream *)local_58,&local_5c);
  for (i_2 = 0; i_2 < *(uint *)(chunk.initial + 0x460); i_2 = i_2 + 1) {
    Write<unsigned_int>((IOStream *)local_58,
                        (uint *)(*(long *)(chunk.initial + 0x468) + (ulong)i_2 * 4));
  }
  for (key._4_4_ = 0; key._4_4_ < *(uint *)(chunk.initial + 0x450); key._4_4_ = key._4_4_ + 1) {
    WriteBinaryNode(this,(IOStream *)local_58,
                    *(aiNode **)(*(long *)(chunk.initial + 0x458) + (ulong)key._4_4_ * 8));
  }
  for (key._0_4_ = 0; (uint)key < local_5c; key._0_4_ = (uint)key + 1) {
    paStack_80 = (aiString *)
                 (*(long *)(*(long *)(chunk.initial + 0x470) + 8) + (ulong)(uint)key * 0x404);
    value._4_4_ = *(undefined4 *)
                   (*(long *)(*(long *)(chunk.initial + 0x470) + 0x10) + (ulong)(uint)key * 0x10);
    local_90 = *(aiString **)
                (*(long *)(*(long *)(chunk.initial + 0x470) + 0x10) + 8 + (ulong)(uint)key * 0x10);
    Write<aiString>((IOStream *)local_58,paStack_80);
    local_92 = value._4_2_;
    Write<unsigned_short>((IOStream *)local_58,&local_92);
    switch(value._4_4_) {
    case 0:
      Write<bool>((IOStream *)local_58,(bool *)local_90);
      break;
    case 1:
      Write<int>((IOStream *)local_58,(int *)local_90);
      break;
    case 2:
      Write<unsigned_long>((IOStream *)local_58,(unsigned_long *)local_90);
      break;
    case 3:
      Write<float>((IOStream *)local_58,(float *)local_90);
      break;
    case 4:
      Write<double>((IOStream *)local_58,(double *)local_90);
      break;
    case 5:
      Write<aiString>((IOStream *)local_58,local_90);
      break;
    case 6:
      Write<aiVector3t<float>>((IOStream *)local_58,(aiVector3D *)local_90);
    }
  }
  AssbinChunkWriter::~AssbinChunkWriter((AssbinChunkWriter *)local_58);
  return;
}

Assistant:

void WriteBinaryNode( IOStream * container, const aiNode* node)
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AINODE );

        unsigned int nb_metadata = (node->mMetaData != NULL ? node->mMetaData->mNumProperties : 0);

        Write<aiString>(&chunk,node->mName);
        Write<aiMatrix4x4>(&chunk,node->mTransformation);
        Write<unsigned int>(&chunk,node->mNumChildren);
        Write<unsigned int>(&chunk,node->mNumMeshes);
        Write<unsigned int>(&chunk,nb_metadata);

        for (unsigned int i = 0; i < node->mNumMeshes;++i) {
            Write<unsigned int>(&chunk,node->mMeshes[i]);
        }

        for (unsigned int i = 0; i < node->mNumChildren;++i) {
            WriteBinaryNode( &chunk, node->mChildren[i] );
        }

        for (unsigned int i = 0; i < nb_metadata; ++i) {
            const aiString& key = node->mMetaData->mKeys[i];
            aiMetadataType type = node->mMetaData->mValues[i].mType;
            void* value = node->mMetaData->mValues[i].mData;

            Write<aiString>(&chunk, key);
            Write<uint16_t>(&chunk, type);

            switch (type) {
                case AI_BOOL:
                    Write<bool>(&chunk, *((bool*) value));
                    break;
                case AI_INT32:
                    Write<int32_t>(&chunk, *((int32_t*) value));
                    break;
                case AI_UINT64:
                    Write<uint64_t>(&chunk, *((uint64_t*) value));
                    break;
                case AI_FLOAT:
                    Write<float>(&chunk, *((float*) value));
                    break;
                case AI_DOUBLE:
                    Write<double>(&chunk, *((double*) value));
                    break;
                case AI_AISTRING:
                    Write<aiString>(&chunk, *((aiString*) value));
                    break;
                case AI_AIVECTOR3D:
                    Write<aiVector3D>(&chunk, *((aiVector3D*) value));
                    break;
#ifdef SWIG
                case FORCE_32BIT:
#endif // SWIG
                default:
                    break;
            }
        }
    }